

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAttDef.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLAttDef::XMLAttDef
          (XMLAttDef *this,XMLCh *attrValue,AttTypes type,DefAttTypes defType,XMLCh *enumValues,
          MemoryManager *manager)

{
  XMLCh *pXVar1;
  CleanupType_conflict8 cleanup;
  JanitorMemFunCall<xercesc_4_0::XMLAttDef> local_28;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLAttDef_00400f08;
  this->fDefaultType = defType;
  this->fType = type;
  this->fCreateReason = NoReason;
  this->fExternalAttribute = false;
  this->fId = 0xfffffffe;
  this->fValue = (XMLCh *)0x0;
  this->fEnumeration = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  local_28.fToCall = (MFPT)cleanUp;
  local_28._16_8_ = 0;
  local_28.fObject = this;
  pXVar1 = XMLString::replicate(attrValue,manager);
  this->fValue = pXVar1;
  pXVar1 = XMLString::replicate(enumValues,this->fMemoryManager);
  this->fEnumeration = pXVar1;
  local_28.fObject = (XMLAttDef *)0x0;
  JanitorMemFunCall<xercesc_4_0::XMLAttDef>::~JanitorMemFunCall(&local_28);
  return;
}

Assistant:

XMLAttDef::XMLAttDef( const XMLCh* const           attrValue
                    , const XMLAttDef::AttTypes    type
                    , const XMLAttDef::DefAttTypes defType
                    , const XMLCh* const           enumValues
                    , MemoryManager* const         manager) :

    fDefaultType(defType)
    , fType(type)
    , fCreateReason(XMLAttDef::NoReason)
    , fExternalAttribute(false)
    , fId(XMLAttDef::fgInvalidAttrId)
    , fValue(0)
    , fEnumeration(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XMLAttDef::cleanUp);

    try
    {
        fValue = XMLString::replicate(attrValue, fMemoryManager);
        fEnumeration = XMLString::replicate(enumValues, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}